

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O1

bool __thiscall
cppcms::http::request::read_key_value
          (request *this,const_iterator *p,const_iterator e,string *key,string *value)

{
  byte bVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  string local_50;
  
  _Var2 = protocol::skip_ws<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    (p->_M_current,e._M_current);
  p->_M_current = _Var2._M_current;
  _Var3 = protocol::tocken<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    (_Var2,e._M_current);
  p->_M_current = _Var3._M_current;
  if (_Var3._M_current < e._M_current && _Var3._M_current == _Var2._M_current) {
    while ((*_Var3._M_current != ';' && (*_Var3._M_current != ','))) {
      _Var3._M_current = _Var3._M_current + 1;
      p->_M_current = _Var3._M_current;
      if (_Var3._M_current == e._M_current) {
        return false;
      }
    }
LAB_001c96c3:
    p->_M_current = _Var3._M_current + 1;
    return false;
  }
  std::__cxx11::string::replace((ulong)key,0,(char *)key->_M_string_length,(ulong)_Var2._M_current);
  _Var3 = protocol::skip_ws<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    (p->_M_current,e._M_current);
  p->_M_current = _Var3._M_current;
  if (e._M_current <= _Var3._M_current) {
    return true;
  }
  bVar1 = *_Var3._M_current;
  _Var2._M_current = (char *)(ulong)bVar1;
  if ((bVar1 == 0x3b) || (bVar1 == 0x2c)) {
    _Var3._M_current = _Var3._M_current + 1;
  }
  else {
    _Var3 = protocol::skip_ws<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      (_Var3._M_current + 1,e._M_current);
    p->_M_current = _Var3._M_current;
    if (e._M_current <= _Var3._M_current) {
      return true;
    }
    begin._M_current = p->_M_current;
    if (*_Var3._M_current == '\"') {
      protocol::unquote<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                (&local_50,(protocol *)p,
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)e._M_current,_Var2);
      std::__cxx11::string::operator=((string *)value,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (p->_M_current == begin._M_current) {
        p->_M_current = (char *)e;
        return false;
      }
    }
    else {
      _Var3 = protocol::tocken<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        (begin,e._M_current);
      p->_M_current = _Var3._M_current;
      std::__cxx11::string::replace
                ((ulong)value,0,(char *)value->_M_string_length,(ulong)begin._M_current);
      _Var3._M_current = p->_M_current;
      if (((_Var3._M_current < e._M_current && _Var3._M_current == begin._M_current) &&
          (*_Var3._M_current != ',')) && (*_Var3._M_current != ';')) {
        while ((*_Var3._M_current != ';' && (*_Var3._M_current != ','))) {
          _Var3._M_current = _Var3._M_current + 1;
          p->_M_current = _Var3._M_current;
          if (_Var3._M_current == e._M_current) {
            return false;
          }
        }
        goto LAB_001c96c3;
      }
    }
    _Var3 = protocol::skip_ws<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      (p->_M_current,e._M_current);
    p->_M_current = _Var3._M_current;
    if (e._M_current <= _Var3._M_current) {
      return true;
    }
    if ((*_Var3._M_current != ';') && (*_Var3._M_current != ',')) {
      return true;
    }
    _Var3 = protocol::skip_ws<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      (_Var3._M_current + 1,e._M_current);
  }
  p->_M_current = _Var3._M_current;
  return true;
}

Assistant:

bool request::read_key_value(
		std::string::const_iterator &p,
		std::string::const_iterator e,
		std::string &key,
		std::string &value)
{
	std::string::const_iterator tmp;
	p=http::protocol::skip_ws(p,e);
	tmp=p;
	p=http::protocol::tocken(p,e);
	if(p==tmp && p<e) {
		skip_after_period(p,e);
		return false;
	}
	key.assign(tmp,p);
	p=http::protocol::skip_ws(p,e);
	if(p<e) {
		if(*p!='=') {
			if(*p==';' || *p==',') {
				++p;
				return true;
			}
		}
	}
	else {
		return true;
	}
	p=http::protocol::skip_ws(p+1,e);
	if(p < e) {
		if(*p=='"') {
			tmp=p;
			value=http::protocol::unquote(p,e);
			if(p==tmp) {
				p=e;
				return false;
			}
		}
		else {
			tmp=p;
			p=http::protocol::tocken(p,e);
			value.assign(tmp,p);
			if(p==tmp && p<e && *p!=';'&& *p!=',') {
				skip_after_period(p,e);
				return false;
			}
		}
	}
	else {
		return true;
	}
	p=http::protocol::skip_ws(p,e);
	if(p<e && (*p==';' || *p==',' ))
		p=http::protocol::skip_ws(p+1,e);
	return true;
}